

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_strategy.c
# Opt level: O0

void set_additional_frame_flags(AV1_COMMON *cm,uint *frame_flags)

{
  int iVar1;
  uint *in_RSI;
  AV1_COMMON *in_RDI;
  
  iVar1 = frame_is_intra_only(in_RDI);
  if (iVar1 != 0) {
    *in_RSI = *in_RSI | 0x10;
  }
  iVar1 = frame_is_sframe(in_RDI);
  if (iVar1 != 0) {
    *in_RSI = *in_RSI | 0x20;
  }
  if (((in_RDI->features).error_resilient_mode & 1U) != 0) {
    *in_RSI = *in_RSI | 0x40;
  }
  return;
}

Assistant:

static void set_additional_frame_flags(const AV1_COMMON *const cm,
                                       unsigned int *const frame_flags) {
  if (frame_is_intra_only(cm)) {
    *frame_flags |= FRAMEFLAGS_INTRAONLY;
  }
  if (frame_is_sframe(cm)) {
    *frame_flags |= FRAMEFLAGS_SWITCH;
  }
  if (cm->features.error_resilient_mode) {
    *frame_flags |= FRAMEFLAGS_ERROR_RESILIENT;
  }
}